

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertSignedBytesEqual
          (UtestShell *this,char expected,char actual,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  char in_DL;
  char in_SIL;
  long *in_RDI;
  undefined8 in_stack_00000008;
  char in_stack_00000016;
  char in_stack_00000017;
  size_t in_stack_00000018;
  char *in_stack_00000020;
  UtestShell *in_stack_00000028;
  SignedBytesEqualFailure *in_stack_00000030;
  SimpleString *in_stack_00000040;
  UtestShell *in_stack_ffffffffffffff18;
  SimpleString *in_stack_ffffffffffffff20;
  undefined1 local_90 [134];
  char local_a;
  char local_9;
  
  local_a = in_DL;
  local_9 = in_SIL;
  pTVar1 = getTestResult(in_stack_ffffffffffffff18);
  (*pTVar1->_vptr_TestResult[10])();
  if (local_9 != local_a) {
    SimpleString::SimpleString(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    SignedBytesEqualFailure::SignedBytesEqualFailure
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
               in_stack_00000017,in_stack_00000016,in_stack_00000040);
    (**(code **)(*in_RDI + 0x138))(in_RDI,local_90,in_stack_00000008);
    SignedBytesEqualFailure::~SignedBytesEqualFailure((SignedBytesEqualFailure *)0x183468);
    SimpleString::~SimpleString((SimpleString *)0x183472);
  }
  return;
}

Assistant:

void UtestShell::assertSignedBytesEqual(signed char expected, signed char actual, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (expected != actual)
        failWith(SignedBytesEqualFailure (this, fileName, lineNumber, expected, actual, text), testTerminator);
}